

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

bool __thiscall QHttp2Stream::sendRST_STREAM(QHttp2Stream *this,Http2Error errorCode)

{
  bool bVar1;
  QHttp2Connection *this_00;
  QHttp2Connection *pQVar2;
  QIODevice *pQVar3;
  ssize_t sVar4;
  size_t __n;
  void *__buf;
  uint in_ESI;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  FrameWriter *frameWriter;
  QHttp2Connection *connection;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_ffffffffffffff78;
  quint32 in_stack_ffffffffffffff7c;
  FrameFlag flags;
  QHttp2Connection *in_stack_ffffffffffffff80;
  Http2Error *in_stack_ffffffffffffff88;
  FrameWriter *this_01;
  bool local_45;
  char local_40 [36];
  uint local_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(in_RDI + 0x68) == 5) || (*(int *)(in_RDI + 0x68) == 0)) {
    local_45 = false;
  }
  else {
    local_1c = in_ESI;
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x2b2248);
    if (bVar1) {
      local_45 = false;
    }
    else {
      this_00 = getConnection((QHttp2Stream *)0x2b2262);
      streamID(in_RDI);
      QHttp2Connection::registerStreamAsResetLocally
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      std::optional<unsigned_int>::operator=
                ((optional<unsigned_int> *)this_00,in_stack_ffffffffffffff88);
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      qHttp2ConnectionLog();
      anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff80,
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_18);
        if (!bVar1) break;
        anon_unknown.dwarf_621b1d::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2b22d4);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)in_stack_ffffffffffffff88,
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (char *)0x2b22ea);
        pQVar2 = getConnection((QHttp2Stream *)0x2b22f4);
        QMessageLogger::debug
                  (local_40,"[%p] sending RST_STREAM on stream %u, code: %u",pQVar2,
                   (ulong)*(uint *)(in_RDI + 0x10),(ulong)local_1c);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      transitionState((QHttp2Stream *)this_00,
                      (StateTransition)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      flags = (FrameFlag)(in_stack_ffffffffffffff7c >> 0x18);
      pQVar2 = getConnection((QHttp2Stream *)0x2b2337);
      this_01 = &pQVar2->frameWriter;
      QFlags<Http2::FrameFlag>::QFlags((QFlags<Http2::FrameFlag> *)this_01,flags);
      __n = (size_t)*(uint *)(in_RDI + 0x10);
      Http2::FrameWriter::start
                ((FrameWriter *)this_00,(FrameType)((ulong)in_stack_ffffffffffffff88 >> 0x38),
                 (QFlagsStorageHelper<Http2::FrameFlag,_4>)SUB84((ulong)in_RDI >> 0x20,0),
                 (quint32)in_stack_ffffffffffffff88);
      Http2::FrameWriter::append<unsigned_int>
                ((FrameWriter *)this_00,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      pQVar3 = QHttp2Connection::getSocket((QHttp2Connection *)0x2b23ae);
      sVar4 = Http2::FrameWriter::write(this_01,(int)pQVar3,__buf,__n);
      local_45 = (bool)((byte)sVar4 & 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_45;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Stream::sendRST_STREAM(Http2::Http2Error errorCode)
{
    if (m_state == State::Closed || m_state == State::Idle)
        return false;
    // Never respond to a RST_STREAM with a RST_STREAM or looping might occur.
    if (m_RST_STREAM_received.has_value())
        return false;

    getConnection()->registerStreamAsResetLocally(streamID());

    m_RST_STREAM_sent = errorCode;
    qCDebug(qHttp2ConnectionLog, "[%p] sending RST_STREAM on stream %u, code: %u", getConnection(),
            m_streamID, errorCode);
    transitionState(StateTransition::RST);

    QHttp2Connection *connection = getConnection();
    FrameWriter &frameWriter = connection->frameWriter;
    frameWriter.start(FrameType::RST_STREAM, FrameFlag::EMPTY, m_streamID);
    frameWriter.append(quint32(errorCode));
    return frameWriter.write(*connection->getSocket());
}